

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O2

bool google::glog_internal_namespace_::IsFailureSignalHandlerInstalled(void)

{
  _union_1457 _Stack_a8;
  sigaction sig_action;
  
  sig_action.sa_mask.__val[0xe] = 0;
  sig_action.sa_mask.__val[0xf] = 0;
  sig_action.sa_flags = 0;
  sig_action._140_4_ = 0;
  sig_action.sa_mask.__val[6] = 0;
  sig_action.sa_mask.__val[7] = 0;
  sig_action.sa_mask.__val[8] = 0;
  sig_action.sa_mask.__val[9] = 0;
  sig_action.sa_mask.__val[10] = 0;
  sig_action.sa_mask.__val[0xb] = 0;
  sig_action.sa_mask.__val[0xc] = 0;
  sig_action.sa_mask.__val[0xd] = 0;
  _Stack_a8.sa_handler = (__sighandler_t)0x0;
  sig_action.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
  sig_action.sa_mask.__val[0] = 0;
  sig_action.sa_mask.__val[1] = 0;
  sig_action.sa_mask.__val[2] = 0;
  sig_action.sa_mask.__val[3] = 0;
  sig_action.sa_mask.__val[4] = 0;
  sig_action.sa_mask.__val[5] = 0;
  sigemptyset((sigset_t *)&sig_action);
  sigaction(6,(sigaction *)0x0,(sigaction *)&_Stack_a8);
  return _Stack_a8.sa_handler == anon_unknown_0::FailureSignalHandler;
}

Assistant:

bool IsFailureSignalHandlerInstalled() {
#ifdef HAVE_SIGACTION
  // TODO(andschwa): Return kFailureSignalHandlerInstalled?
  struct sigaction sig_action;
  memset(&sig_action, 0, sizeof(sig_action));
  sigemptyset(&sig_action.sa_mask);
  sigaction(SIGABRT, NULL, &sig_action);
  if (sig_action.sa_sigaction == &FailureSignalHandler)
    return true;
#elif defined(GLOG_OS_WINDOWS)
  return kFailureSignalHandlerInstalled;
#endif  // HAVE_SIGACTION
  return false;
}